

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O1

void __thiscall unitStrings_Derived_Test::TestBody(unitStrings_Derived_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  precise_unit *ppVar2;
  uint64_t in_RCX;
  string *psVar3;
  string *psVar4;
  char *pcVar5;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  AssertHelper local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string local_38;
  
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar3 = &local_38;
  units::to_string_abi_cxx11_(psVar3,(units *)units::precise::pressure::atm,ppVar2,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_48,"to_string(precise::pressure::atm)","\"atm\"",psVar3,
             (char (*) [4])0x20e206);
  paVar1 = &local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_48.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_40->_M_dataplus)._M_p;
    }
    psVar3 = (string *)0x24;
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x24,pcVar5);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  local_48.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e1;
  psVar4 = &local_38;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_48,ppVar2,(uint64_t)psVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            ((internal *)&local_58,"to_string(N)","\"N\"",psVar4,(char (*) [2])0x1fb6b3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_50->_M_dataplus)._M_p;
    }
    psVar4 = (string *)0x25;
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x25,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  local_48.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ef;
  units::to_string_abi_cxx11_(&local_38,(units *)&local_48,ppVar2,(uint64_t)psVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&local_58,"to_string(Pa)","\"Pa\"",&local_38,(char (*) [3])0x1fb6d2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x26,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  local_48.data_ = (AssertHelperData *)0x3f9a027520000000;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  units::to_string_abi_cxx11_(&local_38,(units *)&local_48,ppVar2,0x3f9a027520000000);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&local_58,"to_string(in)","\"in\"",&local_38,(char (*) [3])0x1ffdc8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x27,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  local_48.data_ = (AssertHelperData *)0x3f9d07a840000000;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000100;
  psVar3 = &local_38;
  units::to_string_abi_cxx11_(psVar3,(units *)&local_48,ppVar2,0x3f9d07a840000000);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&local_58,"to_string(oz)","\"oz\"",psVar3,(char (*) [3])0x2100c7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_50->_M_dataplus)._M_p;
    }
    psVar3 = (string *)0x28;
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x28,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_38;
  units::to_string_abi_cxx11_(psVar4,(units *)units::precise::other::ppb,ppVar2,(uint64_t)psVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_48,"to_string(precise::other::ppb)","\"ppb\"",psVar4,
             (char (*) [4])"ppb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_48.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_40->_M_dataplus)._M_p;
    }
    psVar4 = (string *)0x29;
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x29,pcVar5);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  local_48.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_000800f0;
  psVar3 = &local_38;
  units::to_string_abi_cxx11_(psVar3,(units *)&local_48,ppVar2,(uint64_t)psVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_58,"to_string(kat)","\"kat\"",psVar3,(char (*) [4])"kat");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_50->_M_dataplus)._M_p;
    }
    psVar3 = (string *)0x2a;
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x2a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_38,(units *)units::precise::data::MiB,ppVar2,(uint64_t)psVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_48,"to_string(precise::data::MiB)","\"MiB\"",&local_38,
             (char (*) [4])"MiB");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_48.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x2b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST(unitStrings, Derived)
{
    EXPECT_EQ(to_string(precise::pressure::atm), "atm");
    EXPECT_EQ(to_string(N), "N");
    EXPECT_EQ(to_string(Pa), "Pa");
    EXPECT_EQ(to_string(in), "in");
    EXPECT_EQ(to_string(oz), "oz");
    EXPECT_EQ(to_string(precise::other::ppb), "ppb");
    EXPECT_EQ(to_string(kat), "kat");
    EXPECT_EQ(to_string(precise::data::MiB), "MiB");
}